

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VCompare(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  realtype rVar8;
  double dVar9;
  timespec spec;
  timespec local_40;
  
  if (param_3 < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",param_3);
    iVar5 = 1;
  }
  else {
    uVar6 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6;
      set_element(Z,uVar6,-1.0);
      set_element(X,uVar6,*(realtype *)
                           ((long)&DAT_00112148 +
                           uVar6 * 8 +
                           (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) *
                           -0xc));
      uVar6 = uVar6 + 1;
    } while (param_3 != uVar6);
    clock_gettime(4,&local_40);
    lVar3 = local_40.tv_sec - base_time_tv_sec;
    dVar9 = (double)local_40.tv_nsec;
    N_VCompare(1.0,X,Z);
    uVar6 = 0;
    sync_device();
    clock_gettime(4,&local_40);
    lVar4 = local_40.tv_sec - base_time_tv_sec;
    bVar2 = false;
    do {
      iVar5 = (int)uVar6 + (int)(uVar6 / 3) * -3;
      rVar8 = get_element(Z,uVar6);
      if ((iVar5 == 2) || (iVar5 == 1)) {
        bVar7 = rVar8 == 1.0;
      }
      else {
        bVar7 = rVar8 == 0.0;
      }
      if ((!bVar7) || (NAN(rVar8))) {
        bVar2 = true;
      }
      uVar6 = uVar6 + 1;
    } while (param_3 != uVar6);
    if (bVar2) {
      printf(">>> FAILED test -- N_VCompare, Proc %d \n");
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VCompare ");
        iVar5 = 0;
      }
    }
    max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar4) -
               (dVar9 / 1000000000.0 + (double)lVar3));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VCompare");
    }
  }
  return iVar5;
}

Assistant:

int Test_N_VCompare(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int          mask, fails = 0, failure = 0;
  double       start_time, stop_time, maxt;
  sunindextype i;

  if (local_length < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",
           (long int) local_length);
    return(1);
  }

  /* fill vector data */
  for(i=0; i < local_length; i++){
    set_element(Z, i, NEG_ONE);

    mask = i % 3;
    switch(mask) {

    case 0 :
      /* abs(X[i]) < c */
      set_element(X, i, ZERO);
      break;

    case 1 :
      /* abs(X[i]) = c */
      set_element(X, i, NEG_ONE);
      break;

    case 2 :
      /* abs(X[i]) > c */
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  N_VCompare(ONE, X, Z);
  sync_device();
  stop_time = get_time();

  /* check return vector */
  for(i=0; i < local_length; i++){
    mask = i % 3;

    switch(mask) {

    case 0 :
      /* Z[i] == 0 */
      if (get_element(Z, i) != ZERO)
        failure = 1;
      break;

    case 1 :
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE)
        failure = 1;
      break;

    case 2 :
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE)
        failure = 1;
      break;
    }
  }

  if (failure) {
    printf(">>> FAILED test -- N_VCompare, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VCompare \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VCompare", maxt);

  return(fails);
}